

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O3

time_t __thiscall File::time(File *this,time_t *__timer)

{
  int iVar1;
  char *__file;
  undefined4 extraout_var;
  long lVar2;
  stat buf;
  stat sStack_98;
  
  __file = String::operator_cast_to_char_((String *)this);
  iVar1 = stat(__file,&sStack_98);
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (iVar1 == 0) {
    *__timer = sStack_98.st_mtim.tv_nsec / 1000000 + sStack_98.st_mtim.tv_sec * 1000;
    __timer[1] = sStack_98.st_atim.tv_nsec / 1000000 + sStack_98.st_atim.tv_sec * 1000;
    lVar2 = -(sStack_98.st_ctim.tv_nsec >> 0x3f);
    __timer[2] = sStack_98.st_ctim.tv_nsec / 1000000 + sStack_98.st_ctim.tv_sec * 1000;
  }
  return CONCAT71((int7)((ulong)lVar2 >> 8),iVar1 == 0);
}

Assistant:

bool File::time(const String& file, File::Time& time)
{
#ifdef _WIN32
  WIN32_FIND_DATA wfd;
  HANDLE hFind = FindFirstFileEx(file, // FindFirstFile is faster than GetFileAttribute
#if _WIN32_WINNT > 0x0600
    FindExInfoBasic,
#else
    FindExInfoStandard,
#endif
    &wfd, FindExSearchNameMatch, NULL, 0);
  if(hFind == INVALID_HANDLE_VALUE)
    return false;
  ASSERT(sizeof(DWORD) == 4);
  time.writeTime = ((ULARGE_INTEGER&)wfd.ftLastWriteTime).QuadPart / 10000LL - 11644473600LL* 1000LL;
  time.accessTime = ((ULARGE_INTEGER&)wfd.ftLastAccessTime).QuadPart / 10000LL - 11644473600LL * 1000LL;
  time.creationTime = ((ULARGE_INTEGER&)wfd.ftCreationTime).QuadPart  / 10000LL - 11644473600LL * 1000LL;
  FindClose(hFind);
  return true;
#else
  struct stat buf;
  if(stat(file, &buf) != 0)
    return false;
  time.writeTime = ((long long)buf.st_mtim.tv_sec) * 1000LL + ((long long)buf.st_mtim.tv_nsec) / 1000000LL;
  time.accessTime = ((long long)buf.st_atim.tv_sec) * 1000LL + ((long long)buf.st_atim.tv_nsec) / 1000000LL;
  time.creationTime = ((long long)buf.st_ctim.tv_sec) * 1000LL + ((long long)buf.st_ctim.tv_nsec) / 1000000LL;
  return true;
#endif
}